

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

lest * __thiscall lest::to_string(lest *this,string *txt)

{
  lest local_38 [32];
  string *local_18;
  string *txt_local;
  
  local_18 = txt;
  txt_local = (string *)this;
  make_strg_string(local_38,txt);
  std::__cxx11::string::string((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

inline std::string to_string( std::string     const & txt ) { return make_strg_string( txt ); }